

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

UBool writeStage3Roundtrip(void *context,uint32_t value,UChar32 *codePoints)

{
  long lVar1;
  uint *puVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  if (*(char *)((long)context + 0xcc) == '\t') {
    if (0xffffff < value) {
      if (value < 0x8f000000) {
        value = value & 0x7fffff;
      }
      else {
        value = value & 0xff7fff;
      }
    }
  }
  else if ((*(char *)((long)context + 0xcc) == '\b') && (0xffff < value)) {
    if (value < 0x8f0000) {
      value = value & 0x7fff;
    }
    else {
      value = value & 0xff7f;
    }
  }
  lVar5 = *(long *)((long)context + 0x28);
  lVar6 = *(long *)((long)context + 0xb8);
  lVar8 = 0;
  do {
    uVar4 = *(uint *)((long)codePoints + lVar8);
    if (-1 < (int)uVar4) {
      lVar1 = lVar5 + (ulong)*(ushort *)(lVar5 + (ulong)(uVar4 >> 10) * 2) * 4;
      uVar9 = (ulong)(uVar4 >> 4 & 0x3f);
      uVar10 = (*(uint *)(lVar1 + uVar9 * 4) & 0xffff) << 4 | uVar4 & 0xf;
      cVar3 = *(char *)((long)context + 0xcc);
      if (cVar3 == '\t') {
LAB_002c3abe:
        lVar7 = (ulong)uVar10 * 3;
        *(char *)(lVar6 + lVar7) = (char)(value >> 0x10);
        *(char *)(lVar6 + 1 + lVar7) = (char)(value >> 8);
        *(char *)(lVar6 + 2 + lVar7) = (char)value;
      }
      else if (cVar3 == '\x03') {
        *(uint32_t *)(lVar6 + (ulong)uVar10 * 4) = value;
      }
      else {
        if (cVar3 == '\x02') goto LAB_002c3abe;
        *(short *)(lVar6 + (ulong)uVar10 * 2) = (short)value;
      }
      puVar2 = (uint *)(lVar1 + uVar9 * 4);
      *puVar2 = *puVar2 | 0x10000 << (sbyte)(uVar4 & 0xf);
    }
    value = value + 1;
    lVar8 = lVar8 + 4;
    if (lVar8 == 0x80) {
      return '\x01';
    }
  } while( true );
}

Assistant:

static UBool U_CALLCONV
writeStage3Roundtrip(const void *context, uint32_t value, UChar32 codePoints[32]) {
    UConverterMBCSTable *mbcsTable=(UConverterMBCSTable *)context;
    const uint16_t *table;
    uint32_t *stage2;
    uint8_t *bytes, *p;
    UChar32 c;
    int32_t i, st3;

    table=mbcsTable->fromUnicodeTable;
    bytes=(uint8_t *)mbcsTable->fromUnicodeBytes;

    /* for EUC outputTypes, modify the value like genmbcs.c's transformEUC() */
    switch(mbcsTable->outputType) {
    case MBCS_OUTPUT_3_EUC:
        if(value<=0xffff) {
            /* short sequences are stored directly */
            /* code set 0 or 1 */
        } else if(value<=0x8effff) {
            /* code set 2 */
            value&=0x7fff;
        } else /* first byte is 0x8f */ {
            /* code set 3 */
            value&=0xff7f;
        }
        break;
    case MBCS_OUTPUT_4_EUC:
        if(value<=0xffffff) {
            /* short sequences are stored directly */
            /* code set 0 or 1 */
        } else if(value<=0x8effffff) {
            /* code set 2 */
            value&=0x7fffff;
        } else /* first byte is 0x8f */ {
            /* code set 3 */
            value&=0xff7fff;
        }
        break;
    default:
        break;
    }

    for(i=0; i<=0x1f; ++value, ++i) {
        c=codePoints[i];
        if(c<0) {
            continue;
        }

        /* locate the stage 2 & 3 data */
        stage2=((uint32_t *)table)+table[c>>10]+((c>>4)&0x3f);
        p=bytes;
        st3=(int32_t)(uint16_t)*stage2*16+(c&0xf);

        /* write the codepage bytes into stage 3 */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4_EUC:
            p+=st3*3;
            p[0]=(uint8_t)(value>>16);
            p[1]=(uint8_t)(value>>8);
            p[2]=(uint8_t)value;
            break;
        case MBCS_OUTPUT_4:
            ((uint32_t *)p)[st3]=value;
            break;
        default:
            /* 2 bytes per character */
            ((uint16_t *)p)[st3]=(uint16_t)value;
            break;
        }

        /* set the roundtrip flag */
        *stage2|=(1UL<<(16+(c&0xf)));
    }
    return TRUE;
 }